

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O1

void PredictorSub13_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  undefined1 auVar23 [15];
  unkuint9 Var24;
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  uint32_t uVar27;
  uint32_t uVar28;
  uint32_t uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ushort uVar36;
  byte bVar39;
  byte bVar40;
  byte bVar41;
  byte bVar42;
  byte bVar43;
  undefined1 auVar37 [14];
  undefined1 auVar38 [11];
  byte bVar44;
  short sVar45;
  ushort uVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  undefined1 auVar46 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  short sVar63;
  short sVar64;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  undefined1 auVar65 [16];
  undefined1 auVar73 [16];
  short sVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  
  auVar31 = _DAT_001b3b20;
  auVar30 = _DAT_001b2b80;
  uVar35 = 0;
  if (3 < num_pixels) {
    uVar34 = 0;
    do {
      auVar82 = *(undefined1 (*) [16])(in + (uVar34 - 1));
      puVar1 = in + uVar34;
      cVar11 = *(char *)((long)puVar1 + 1);
      cVar12 = *(char *)((long)puVar1 + 2);
      cVar13 = *(char *)((long)puVar1 + 3);
      uVar27 = puVar1[1];
      cVar14 = *(char *)((long)puVar1 + 5);
      cVar15 = *(char *)((long)puVar1 + 6);
      cVar16 = *(char *)((long)puVar1 + 7);
      uVar28 = puVar1[2];
      cVar17 = *(char *)((long)puVar1 + 9);
      cVar18 = *(char *)((long)puVar1 + 10);
      cVar19 = *(char *)((long)puVar1 + 0xb);
      uVar29 = puVar1[3];
      cVar20 = *(char *)((long)puVar1 + 0xd);
      cVar21 = *(char *)((long)puVar1 + 0xe);
      cVar22 = *(char *)((long)puVar1 + 0xf);
      auVar3 = *(undefined1 (*) [16])(upper + (uVar34 - 1));
      auVar54 = *(undefined1 (*) [16])(upper + uVar34);
      auVar81 = auVar54 & auVar82;
      auVar37 = auVar54._2_14_ ^ auVar82._2_14_;
      auVar72._0_14_ = auVar82._0_14_;
      auVar72[0xe] = auVar82[7];
      auVar72[0xf] = auVar82[7];
      auVar71._14_2_ = auVar72._14_2_;
      auVar71._0_13_ = auVar82._0_13_;
      auVar71[0xd] = auVar82[6];
      auVar70._13_3_ = auVar71._13_3_;
      auVar70._0_12_ = auVar82._0_12_;
      auVar70[0xc] = auVar82[6];
      auVar69._12_4_ = auVar70._12_4_;
      auVar69._0_11_ = auVar82._0_11_;
      auVar69[0xb] = auVar82[5];
      auVar68._11_5_ = auVar69._11_5_;
      auVar68._0_10_ = auVar82._0_10_;
      auVar68[10] = auVar82[5];
      auVar67._10_6_ = auVar68._10_6_;
      auVar67._0_9_ = auVar82._0_9_;
      auVar67[9] = auVar82[4];
      auVar66._9_7_ = auVar67._9_7_;
      auVar66._0_8_ = auVar82._0_8_;
      auVar66[8] = auVar82[4];
      auVar65._8_8_ = auVar66._8_8_;
      auVar65[7] = auVar82[3];
      auVar65[6] = auVar82[3];
      auVar65[5] = auVar82[2];
      auVar65[4] = auVar82[2];
      auVar65[3] = auVar82[1];
      auVar65[2] = auVar82[1];
      auVar65[0] = auVar82[0];
      auVar65[1] = auVar65[0];
      auVar52._0_14_ = auVar54._0_14_;
      auVar52[0xe] = auVar54[7];
      auVar52[0xf] = auVar54[7];
      auVar51._14_2_ = auVar52._14_2_;
      auVar51._0_13_ = auVar54._0_13_;
      auVar51[0xd] = auVar54[6];
      auVar50._13_3_ = auVar51._13_3_;
      auVar50._0_12_ = auVar54._0_12_;
      auVar50[0xc] = auVar54[6];
      auVar49._12_4_ = auVar50._12_4_;
      auVar49._0_11_ = auVar54._0_11_;
      auVar49[0xb] = auVar54[5];
      auVar48._11_5_ = auVar49._11_5_;
      auVar48._0_10_ = auVar54._0_10_;
      auVar48[10] = auVar54[5];
      auVar47._10_6_ = auVar48._10_6_;
      auVar47._0_9_ = auVar54._0_9_;
      auVar47[9] = auVar54[4];
      auVar46._9_7_ = auVar47._9_7_;
      auVar46._0_8_ = auVar54._0_8_;
      auVar46[8] = auVar54[4];
      auVar53._8_8_ = auVar46._8_8_;
      auVar53[7] = auVar54[3];
      auVar53[6] = auVar54[3];
      auVar53[5] = auVar54[2];
      auVar53[4] = auVar54[2];
      auVar53[3] = auVar54[1];
      auVar53[2] = auVar54[1];
      auVar53[0] = auVar54[0];
      auVar53[1] = auVar53[0];
      auVar4[0xd] = 0;
      auVar4._0_13_ = auVar3._0_13_;
      auVar4[0xe] = auVar3[7];
      auVar5[0xc] = auVar3[6];
      auVar5._0_12_ = auVar3._0_12_;
      auVar5._13_2_ = auVar4._13_2_;
      auVar6[0xb] = 0;
      auVar6._0_11_ = auVar3._0_11_;
      auVar6._12_3_ = auVar5._12_3_;
      auVar7[10] = auVar3[5];
      auVar7._0_10_ = auVar3._0_10_;
      auVar7._11_4_ = auVar6._11_4_;
      auVar8[9] = 0;
      auVar8._0_9_ = auVar3._0_9_;
      auVar8._10_5_ = auVar7._10_5_;
      auVar9[8] = auVar3[4];
      auVar9._0_8_ = auVar3._0_8_;
      auVar9._9_6_ = auVar8._9_6_;
      auVar23._7_8_ = 0;
      auVar23._0_7_ = auVar9._8_7_;
      Var24 = CONCAT81(SUB158(auVar23 << 0x40,7),auVar3[3]);
      auVar25._9_6_ = 0;
      auVar25._0_9_ = Var24;
      auVar38._1_10_ = SUB1510(auVar25 << 0x30,5);
      auVar38[0] = auVar3[2];
      auVar26._11_4_ = 0;
      auVar26._0_11_ = auVar38;
      auVar10[2] = auVar3[1];
      auVar10._0_2_ = auVar3._0_2_;
      auVar10._3_12_ = SUB1512(auVar26 << 0x20,3);
      uVar56 = auVar3._0_2_ & 0xff;
      auVar82 = auVar53 & auVar65;
      auVar53 = auVar53 ^ auVar65;
      auVar54._0_2_ = auVar53._0_2_ >> 1;
      auVar54._2_2_ = auVar53._2_2_ >> 1;
      auVar54._4_2_ = auVar53._4_2_ >> 1;
      auVar54._6_2_ = auVar53._6_2_ >> 1;
      auVar54._8_2_ = auVar53._8_2_ >> 1;
      auVar54._10_2_ = auVar53._10_2_ >> 1;
      auVar54._12_2_ = auVar53._12_2_ >> 1;
      auVar54._14_2_ = auVar53._14_2_ >> 1;
      auVar54 = auVar54 & auVar31;
      auVar55[0] = auVar54[0] + auVar82[0];
      auVar55[1] = auVar54[1] + auVar82[1];
      auVar55[2] = auVar54[2] + auVar82[2];
      auVar55[3] = auVar54[3] + auVar82[3];
      auVar55[4] = auVar54[4] + auVar82[4];
      auVar55[5] = auVar54[5] + auVar82[5];
      auVar55[6] = auVar54[6] + auVar82[6];
      auVar55[7] = auVar54[7] + auVar82[7];
      auVar55[8] = auVar54[8] + auVar82[8];
      auVar55[9] = auVar54[9] + auVar82[9];
      auVar55[10] = auVar54[10] + auVar82[10];
      auVar55[0xb] = auVar54[0xb] + auVar82[0xb];
      auVar55[0xc] = auVar54[0xc] + auVar82[0xc];
      auVar55[0xd] = auVar54[0xd] + auVar82[0xd];
      auVar55[0xe] = auVar54[0xe] + auVar82[0xe];
      auVar55[0xf] = auVar54[0xf] + auVar82[0xf];
      auVar55 = auVar55 & auVar30;
      sVar64 = auVar55._0_2_;
      sVar74 = auVar55._2_2_;
      sVar75 = auVar55._4_2_;
      sVar76 = auVar55._6_2_;
      sVar45 = (short)Var24;
      sVar77 = auVar55._8_2_;
      sVar78 = auVar55._10_2_;
      sVar79 = auVar55._12_2_;
      sVar80 = auVar55._14_2_;
      uVar36 = auVar4._13_2_ >> 8;
      auVar73._0_2_ = (sVar64 - uVar56) + (ushort)(sVar64 < (short)uVar56);
      auVar73._2_2_ = (sVar74 - auVar10._2_2_) + (ushort)(sVar74 < auVar10._2_2_);
      auVar73._4_2_ = (sVar75 - auVar38._0_2_) + (ushort)(sVar75 < auVar38._0_2_);
      auVar73._6_2_ = (sVar76 - sVar45) + (ushort)(sVar76 < sVar45);
      auVar73._8_2_ = (sVar77 - auVar9._8_2_) + (ushort)(sVar77 < auVar9._8_2_);
      auVar73._10_2_ = (sVar78 - auVar7._10_2_) + (ushort)(sVar78 < auVar7._10_2_);
      auVar73._12_2_ = (sVar79 - auVar5._12_2_) + (ushort)(sVar79 < auVar5._12_2_);
      auVar73._14_2_ = (sVar80 - uVar36) + (ushort)(sVar80 < (short)uVar36);
      auVar82 = psraw(auVar73,1);
      sVar64 = auVar82._0_2_ + sVar64;
      sVar74 = auVar82._2_2_ + sVar74;
      sVar75 = auVar82._4_2_ + sVar75;
      sVar76 = auVar82._6_2_ + sVar76;
      sVar77 = auVar82._8_2_ + sVar77;
      sVar78 = auVar82._10_2_ + sVar78;
      sVar79 = auVar82._12_2_ + sVar79;
      sVar80 = auVar82._14_2_ + sVar80;
      auVar82._2_2_ = auVar37._8_2_ >> 1;
      auVar82._0_2_ = auVar37._6_2_ >> 1;
      auVar82._4_2_ = auVar37._10_2_ >> 1;
      auVar82._6_2_ = auVar37._12_2_ >> 1;
      auVar82._8_8_ = 0;
      auVar38 = SUB1611(auVar82 << 0x40,5) & auVar31._5_11_;
      bVar39 = auVar38[5] + auVar81[10];
      bVar40 = auVar38[6] + auVar81[0xb];
      bVar41 = auVar38[7] + auVar81[0xc];
      bVar42 = auVar38[8] + auVar81[0xd];
      bVar43 = auVar38[9] + auVar81[0xe];
      bVar44 = auVar38[10] + auVar81[0xf];
      uVar36 = (ushort)(byte)(auVar38[3] + auVar81[8]);
      uVar56 = (ushort)(byte)(auVar38[4] + auVar81[9]);
      auVar81._0_2_ = (uVar36 - auVar3[8]) + (ushort)(uVar36 < auVar3[8]);
      auVar81._2_2_ = (uVar56 - auVar3[9]) + (ushort)(uVar56 < auVar3[9]);
      auVar81._4_2_ =
           ((ushort)bVar39 - (ushort)auVar3[10]) + (ushort)((ushort)bVar39 < (ushort)auVar3[10]);
      auVar81._6_2_ =
           ((ushort)bVar40 - (ushort)auVar3[0xb]) + (ushort)((ushort)bVar40 < (ushort)auVar3[0xb]);
      auVar81._8_2_ =
           ((ushort)bVar41 - (ushort)auVar3[0xc]) + (ushort)((ushort)bVar41 < (ushort)auVar3[0xc]);
      auVar81._10_2_ =
           ((ushort)bVar42 - (ushort)auVar3[0xd]) + (ushort)((ushort)bVar42 < (ushort)auVar3[0xd]);
      auVar81._12_2_ =
           ((ushort)bVar43 - (ushort)auVar3[0xe]) + (ushort)((ushort)bVar43 < (ushort)auVar3[0xe]);
      auVar81._14_2_ =
           ((ushort)bVar44 - (ushort)auVar3[0xf]) + (ushort)((ushort)bVar44 < (ushort)auVar3[0xf]);
      auVar82 = psraw(auVar81,1);
      sVar45 = auVar82._0_2_ + uVar36;
      sVar57 = auVar82._2_2_ + uVar56;
      sVar58 = auVar82._4_2_ + (ushort)bVar39;
      sVar59 = auVar82._6_2_ + (ushort)bVar40;
      sVar60 = auVar82._8_2_ + (ushort)bVar41;
      sVar61 = auVar82._10_2_ + (ushort)bVar42;
      sVar62 = auVar82._12_2_ + (ushort)bVar43;
      sVar63 = auVar82._14_2_ + (ushort)bVar44;
      puVar2 = out + uVar34;
      *(char *)puVar2 =
           (char)*puVar1 - ((0 < sVar64) * (sVar64 < 0x100) * (char)sVar64 - (0xff < sVar64));
      *(char *)((long)puVar2 + 1) =
           cVar11 - ((0 < sVar74) * (sVar74 < 0x100) * (char)sVar74 - (0xff < sVar74));
      *(char *)((long)puVar2 + 2) =
           cVar12 - ((0 < sVar75) * (sVar75 < 0x100) * (char)sVar75 - (0xff < sVar75));
      *(char *)((long)puVar2 + 3) =
           cVar13 - ((0 < sVar76) * (sVar76 < 0x100) * (char)sVar76 - (0xff < sVar76));
      *(char *)(puVar2 + 1) =
           (char)uVar27 - ((0 < sVar77) * (sVar77 < 0x100) * (char)sVar77 - (0xff < sVar77));
      *(char *)((long)puVar2 + 5) =
           cVar14 - ((0 < sVar78) * (sVar78 < 0x100) * (char)sVar78 - (0xff < sVar78));
      *(char *)((long)puVar2 + 6) =
           cVar15 - ((0 < sVar79) * (sVar79 < 0x100) * (char)sVar79 - (0xff < sVar79));
      *(char *)((long)puVar2 + 7) =
           cVar16 - ((0 < sVar80) * (sVar80 < 0x100) * (char)sVar80 - (0xff < sVar80));
      *(char *)(puVar2 + 2) =
           (char)uVar28 - ((0 < sVar45) * (sVar45 < 0x100) * (char)sVar45 - (0xff < sVar45));
      *(char *)((long)puVar2 + 9) =
           cVar17 - ((0 < sVar57) * (sVar57 < 0x100) * (char)sVar57 - (0xff < sVar57));
      *(char *)((long)puVar2 + 10) =
           cVar18 - ((0 < sVar58) * (sVar58 < 0x100) * (char)sVar58 - (0xff < sVar58));
      *(char *)((long)puVar2 + 0xb) =
           cVar19 - ((0 < sVar59) * (sVar59 < 0x100) * (char)sVar59 - (0xff < sVar59));
      *(char *)(puVar2 + 3) =
           (char)uVar29 - ((0 < sVar60) * (sVar60 < 0x100) * (char)sVar60 - (0xff < sVar60));
      *(char *)((long)puVar2 + 0xd) =
           cVar20 - ((0 < sVar61) * (sVar61 < 0x100) * (char)sVar61 - (0xff < sVar61));
      *(char *)((long)puVar2 + 0xe) =
           cVar21 - ((0 < sVar62) * (sVar62 < 0x100) * (char)sVar62 - (0xff < sVar62));
      *(char *)((long)puVar2 + 0xf) =
           cVar22 - ((0 < sVar63) * (sVar63 < 0x100) * (char)sVar63 - (0xff < sVar63));
      uVar35 = uVar34 + 4;
      uVar33 = uVar34 + 8;
      uVar34 = uVar35;
    } while (uVar33 <= (uint)num_pixels);
  }
  iVar32 = num_pixels - (int)uVar35;
  if (iVar32 == 0) {
    return;
  }
  uVar35 = uVar35 & 0xffffffff;
  (*VP8LPredictorsSub_C[0xd])(in + uVar35,upper + uVar35,iVar32,out + uVar35);
  return;
}

Assistant:

static void PredictorSub13_SSE2(const uint32_t* in, const uint32_t* upper,
                                int num_pixels, uint32_t* WEBP_RESTRICT out) {
  int i;
  const __m128i zero = _mm_setzero_si128();
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    const __m128i L = _mm_loadu_si128((const __m128i*)&in[i - 1]);
    const __m128i src = _mm_loadu_si128((const __m128i*)&in[i]);
    const __m128i T = _mm_loadu_si128((const __m128i*)&upper[i]);
    const __m128i TL = _mm_loadu_si128((const __m128i*)&upper[i - 1]);
    __m128i A4_lo, A4_hi;
    // lo.
    {
      const __m128i L_lo = _mm_unpacklo_epi8(L, zero);
      const __m128i T_lo = _mm_unpacklo_epi8(T, zero);
      const __m128i TL_lo = _mm_unpacklo_epi8(TL, zero);
      const __m128i sum_lo = _mm_add_epi16(T_lo, L_lo);
      const __m128i avg_lo = _mm_srli_epi16(sum_lo, 1);
      const __m128i A1_lo = _mm_sub_epi16(avg_lo, TL_lo);
      const __m128i bit_fix_lo = _mm_cmpgt_epi16(TL_lo, avg_lo);
      const __m128i A2_lo = _mm_sub_epi16(A1_lo, bit_fix_lo);
      const __m128i A3_lo = _mm_srai_epi16(A2_lo, 1);
      A4_lo = _mm_add_epi16(avg_lo, A3_lo);
    }
    // hi.
    {
      const __m128i L_hi = _mm_unpackhi_epi8(L, zero);
      const __m128i T_hi = _mm_unpackhi_epi8(T, zero);
      const __m128i TL_hi = _mm_unpackhi_epi8(TL, zero);
      const __m128i sum_hi = _mm_add_epi16(T_hi, L_hi);
      const __m128i avg_hi = _mm_srli_epi16(sum_hi, 1);
      const __m128i A1_hi = _mm_sub_epi16(avg_hi, TL_hi);
      const __m128i bit_fix_hi = _mm_cmpgt_epi16(TL_hi, avg_hi);
      const __m128i A2_hi = _mm_sub_epi16(A1_hi, bit_fix_hi);
      const __m128i A3_hi = _mm_srai_epi16(A2_hi, 1);
      A4_hi = _mm_add_epi16(avg_hi, A3_hi);
    }
    {
      const __m128i pred = _mm_packus_epi16(A4_lo, A4_hi);
      const __m128i res = _mm_sub_epi8(src, pred);
      _mm_storeu_si128((__m128i*)&out[i], res);
    }
  }
  if (i != num_pixels) {
    VP8LPredictorsSub_C[13](in + i, upper + i, num_pixels - i, out + i);
  }
}